

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

Aig_Man_t * Saig_ManDupWithCubes(Aig_Man_t *pAig,Vec_Vec_t *vReg2Value)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  Vec_Int_t *p_01;
  int local_40;
  int Lit;
  int k;
  int i;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigNew;
  Vec_Int_t *vLevel;
  Vec_Vec_t *vReg2Value_local;
  Aig_Man_t *pAig_local;
  
  if (pAig->nConstrs != 0) {
    __assert_fail("pAig->nConstrs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x98,"Aig_Man_t *Saig_ManDupWithCubes(Aig_Man_t *, Vec_Vec_t *)");
  }
  iVar1 = Aig_ManNodeNum(pAig);
  iVar2 = Vec_VecSizeSize(vReg2Value);
  p_00 = Aig_ManStart(iVar1 + iVar2);
  pcVar3 = Abc_UtilStrsav(pAig->pName);
  p_00->pName = pcVar3;
  pAVar4 = Aig_ManConst1(p_00);
  pAVar5 = Aig_ManConst1(pAig);
  (pAVar5->field_5).pData = pAVar4;
  for (Lit = 0; iVar1 = Vec_PtrSize(pAig->vCis), Lit < iVar1; Lit = Lit + 1) {
    pvVar6 = Vec_PtrEntry(pAig->vCis,Lit);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  for (Lit = 0; iVar1 = Vec_PtrSize(pAig->vObjs), Lit < iVar1; Lit = Lit + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,Lit);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      p1 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p_00,pAVar5,p1);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  for (Lit = 0; iVar1 = Vec_VecSize(vReg2Value), Lit < iVar1; Lit = Lit + 1) {
    p_01 = Vec_VecEntryInt(vReg2Value,Lit);
    _k = Aig_ManConst1(p_00);
    for (local_40 = 0; iVar1 = Vec_IntSize(p_01), local_40 < iVar1; local_40 = local_40 + 1) {
      iVar1 = Vec_IntEntry(p_01,local_40);
      iVar2 = Abc_Lit2Var(iVar1);
      pAVar4 = Saig_ManLi(pAig,iVar2);
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      iVar1 = Abc_LitIsCompl(iVar1);
      pAVar4 = Aig_NotCond(pAVar4,iVar1);
      _k = Aig_And(p_00,_k,pAVar4);
    }
    Aig_ObjCreateCo(p_00,_k);
  }
  for (Lit = 0; iVar1 = Saig_ManRegNum(pAig), Lit < iVar1; Lit = Lit + 1) {
    p = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,Lit + iVar1);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  Aig_ManCleanup(p_00);
  iVar1 = Aig_ManRegNum(pAig);
  Aig_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManDupWithCubes( Aig_Man_t * pAig, Vec_Vec_t * vReg2Value )
{
    Vec_Int_t * vLevel;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pMiter;
    int i, k, Lit;
    assert( pAig->nConstrs == 0 );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) + Vec_VecSizeSize(vReg2Value) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs for cubes
    Vec_VecForEachLevelInt( vReg2Value, vLevel, i )
    {
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vLevel, Lit, k )
        {
            pObj = Saig_ManLi( pAig, Abc_Lit2Var(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, Aig_NotCond(Aig_ObjChild0Copy(pObj), Abc_LitIsCompl(Lit)) );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}